

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_info.hpp
# Opt level: O0

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  bool bVar1;
  bool local_62;
  allocator local_39;
  string local_38 [32];
  string *local_18;
  string *tag_local;
  
  local_18 = tag;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,".",&local_39);
  bVar1 = startsWith(tag,(string *)local_38);
  local_62 = true;
  if (!bVar1) {
    bVar1 = std::operator==(local_18,"hide");
    local_62 = true;
    if (!bVar1) {
      local_62 = std::operator==(local_18,"!hide");
    }
  }
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (local_62 == false) {
    bVar1 = std::operator==(local_18,"!throws");
    if (bVar1) {
      tag_local._4_4_ = Throws;
    }
    else {
      bVar1 = std::operator==(local_18,"!shouldfail");
      if (bVar1) {
        tag_local._4_4_ = ShouldFail;
      }
      else {
        bVar1 = std::operator==(local_18,"!mayfail");
        if (bVar1) {
          tag_local._4_4_ = MayFail;
        }
        else {
          tag_local._4_4_ = None;
        }
      }
    }
  }
  else {
    tag_local._4_4_ = IsHidden;
  }
  return tag_local._4_4_;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( startsWith( tag, "." ) ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }